

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-io.h
# Opt level: O2

void __thiscall
mp::SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>::
SolutionWriterImpl(SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>
                   *this,StringRef stub,MultiObjTestSolver<2> *s,MultiObjMockProblemBuilder *b,
                  ArrayRef<long> *options)

{
  BasicStringRef<char> local_30;
  
  local_30.size_ = stub.size_;
  local_30.data_ = stub.data_;
  (this->super_SolutionHandler)._vptr_SolutionHandler =
       (_func_int **)&PTR__SolutionWriterImpl_00263bb0;
  fmt::BasicStringRef<char>::to_string_abi_cxx11_(&this->stub_,&local_30);
  (this->overrideStub_)._M_dataplus._M_p = (pointer)&(this->overrideStub_).field_2;
  (this->overrideStub_)._M_string_length = 0;
  (this->overrideStub_).field_2._M_local_buf[0] = '\0';
  this->solver_ = s;
  this->builder_ = b;
  (this->options_).save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->options_).save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options_).save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->options_).data_ = options->data_;
  (this->options_).size_ = options->size_;
  this->num_solutions_ = 0;
  return;
}

Assistant:

SolutionWriterImpl(fmt::StringRef stub, Solver &s, ProblemBuilder &b,
                 ArrayRef<long> options = mp::ArrayRef<long>(0, 0))
    : stub_(stub.to_string()), overrideStub_(), solver_(s), builder_(b),
      options_(options), num_solutions_(0) {}